

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

int discard_sentmap_by_epoch(quicly_conn_t *conn,uint ack_epochs)

{
  int iVar1;
  quicly_sentmap_iter_t iter;
  quicly_sentmap_iter_t local_38;
  
  iVar1 = quicly_loss_init_sentmap_iter
                    (&(conn->egress).loss,&local_38,(conn->stash).now,
                     (uint)(conn->super).remote.transport_params.max_ack_delay,
                     (uint)(QUICLY_STATE_CONNECTED < (conn->super).state));
  if (iVar1 != 0) {
    return iVar1;
  }
  if ((local_38.p)->acked == quicly_sentmap__type_packet) {
    do {
      if (((local_38.p)->data).packet.packet_number == 0xffffffffffffffff) {
        return 0;
      }
      if ((ack_epochs >> (*(uint *)((long)&(local_38.p)->data + 0x10) & 0x1f) & 1) == 0) {
        quicly_sentmap_skip(&local_38);
      }
      else {
        iVar1 = quicly_sentmap_update
                          (&(conn->egress).loss.sentmap,&local_38,QUICLY_SENTMAP_EVENT_EXPIRED);
        if (iVar1 != 0) {
          return iVar1;
        }
      }
    } while ((local_38.p)->acked == quicly_sentmap__type_packet);
  }
  __assert_fail("iter->p->acked == quicly_sentmap__type_packet",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/sentmap.h"
                ,0x13c,"const quicly_sent_packet_t *quicly_sentmap_get(quicly_sentmap_iter_t *)");
}

Assistant:

int discard_sentmap_by_epoch(quicly_conn_t *conn, unsigned ack_epochs)
{
    quicly_sentmap_iter_t iter;
    const quicly_sent_packet_t *sent;
    int ret;

    if ((ret = init_acks_iter(conn, &iter)) != 0)
        return ret;

    while ((sent = quicly_sentmap_get(&iter))->packet_number != UINT64_MAX) {
        if ((ack_epochs & (1u << sent->ack_epoch)) != 0) {
            if ((ret = quicly_sentmap_update(&conn->egress.loss.sentmap, &iter, QUICLY_SENTMAP_EVENT_EXPIRED)) != 0)
                return ret;
        } else {
            quicly_sentmap_skip(&iter);
        }
    }

    return ret;
}